

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularTrimmedSurface::~IfcRectangularTrimmedSurface
          (IfcRectangularTrimmedSurface *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcBoundedSurface).super_IfcSurface.
                   super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  plVar2 = (long *)((this->Vsense).field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x15] = 0x86b780;
  plVar2[2] = 0x86b848;
  plVar2[-0x13] = 0x86b7a8;
  plVar2[-0x11] = 0x86b7d0;
  plVar2[-0xf] = 0x86b7f8;
  plVar2[-0xd] = 0x86b820;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  if (*(code **)(p_Var1 + 0x78) != p_Var1 + 0x88) {
    operator_delete(*(code **)(p_Var1 + 0x78),*(long *)(p_Var1 + 0x88) + 1);
  }
  operator_delete(p_Var1,0xd0);
  return;
}

Assistant:

IfcRectangularTrimmedSurface() : Object("IfcRectangularTrimmedSurface") {}